

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetStringReference
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  ExtensionSet *this_00;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar2;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringReference","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringReference",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetStringReference",CPPTYPE_STRING);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    this_00 = GetExtensionSet(this,message);
    psVar1 = ExtensionSet::GetString(this_00,*(int *)(field + 0x28),*(string **)(field + 0x70));
    return psVar1;
  }
  ppbVar2 = GetRaw<std::__cxx11::string_const*>(this,message,field);
  return *ppbVar2;
}

Assistant:

const string& GeneratedMessageReflection::GetStringReference(
    const Message& message,
    const FieldDescriptor* field, string* scratch) const {
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        return *GetField<const string*>(message, field);
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return kEmptyString;  // Make compiler happy.
  }
}